

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::StringLenMethod::StringLenMethod(StringLenMethod *this,Compilation *comp)

{
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_58;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"len","");
  local_58.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,&local_40,Function,0,&local_58,comp->intType,true,
             false);
  if (local_58.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_004f0f30;
  return;
}

Assistant:

explicit StringLenMethod(Compilation& comp) :
        SimpleSystemSubroutine("len", SubroutineKind::Function, 0, {}, comp.getIntType(), true) {}